

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O2

void __thiscall
testing::internal::XmlUnitTestResultPrinter::ListTestsMatchingFilter
          (XmlUnitTestResultPrinter *this,
          vector<testing::TestCase_*,_std::allocator<testing::TestCase_*>_> *test_cases)

{
  FILE *__stream;
  stringstream stream;
  string local_1b8;
  stringstream local_198 [16];
  ostream local_188 [376];
  
  __stream = (FILE *)OpenFileForWriting(&this->output_file_);
  std::__cxx11::stringstream::stringstream(local_198);
  PrintXmlTestsList(local_188,test_cases);
  StringStreamToString(&local_1b8,(stringstream *)local_198);
  fputs(local_1b8._M_dataplus._M_p,__stream);
  std::__cxx11::string::~string((string *)&local_1b8);
  fclose(__stream);
  std::__cxx11::stringstream::~stringstream(local_198);
  return;
}

Assistant:

void XmlUnitTestResultPrinter::ListTestsMatchingFilter(
    const std::vector<TestCase*>& test_cases) {
  FILE* xmlout = OpenFileForWriting(output_file_);
  std::stringstream stream;
  PrintXmlTestsList(&stream, test_cases);
  fprintf(xmlout, "%s", StringStreamToString(&stream).c_str());
  fclose(xmlout);
}